

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::ExtensionRangeOptions::_InternalParse
          (ExtensionRangeOptions *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  int iVar2;
  bool bVar3;
  UninterpretedOption *msg;
  Rep *pRVar4;
  uint res;
  int iVar5;
  UnknownFieldSet *unknown;
  byte *ptr_00;
  pair<const_char_*,_unsigned_int> pVar6;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    do {
      bVar1 = *local_38;
      res = (uint)bVar1;
      ptr_00 = local_38 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*ptr_00 * 0x80) - 0x80;
        if ((char)*ptr_00 < '\0') {
          pVar6 = internal::ReadTagFallback((char *)local_38,res);
          res = pVar6.second;
          ptr_00 = (byte *)pVar6.first;
          if (ptr_00 == (byte *)0x0) {
            return (char *)0x0;
          }
        }
        else {
          ptr_00 = local_38 + 2;
        }
      }
      if (res == 0x1f3a) {
        local_38 = ptr_00 + -2;
        do {
          local_38 = local_38 + 2;
          pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
            iVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
LAB_00297717:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar5 + 1);
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar5 = pRVar4->allocated_size;
LAB_00297727:
            pRVar4->allocated_size = iVar5 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
            pRVar4->elements[iVar5] = msg;
          }
          else {
            iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            iVar5 = pRVar4->allocated_size;
            if (iVar5 <= iVar2) {
              if (iVar5 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00297717;
              goto LAB_00297727;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (UninterpretedOption *)pRVar4->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::UninterpretedOption>
                                       (ctx,msg,(char *)local_38);
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(short *)local_38 == 0x3eba));
      }
      else {
        if ((res == 0) || ((res & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)ptr_00;
        }
        local_38 = ptr_00;
        if (res < 8000) {
          if (((ulong)this_00->ptr_ & 1) == 0) {
            unknown = internal::InternalMetadata::
                      mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
          }
          else {
            unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
          }
          local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
        }
        else {
          local_38 = (byte *)internal::ExtensionSet::ParseField
                                       (&this->_extensions_,(ulong)res,(char *)ptr_00,
                                        (Message *)_ExtensionRangeOptions_default_instance_,this_00,
                                        ctx);
        }
        if (local_38 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_38;
}

Assistant:

const char* ExtensionRangeOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}